

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O0

int __thiscall Centaurus::LookaheadDFA<wchar_t>::get_color_num(LookaheadDFA<wchar_t> *this)

{
  bool bVar1;
  int iVar2;
  vector<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_> *this_00;
  reference this_01;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  *this_02;
  int *piVar3;
  int local_5c;
  NFATransition<wchar_t> *local_58;
  NFATransition<wchar_t> *tr;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  *__range3;
  LDFAState<wchar_t> *state;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_> *__range2;
  LookaheadDFA<wchar_t> *pLStack_10;
  int max_color_index;
  LookaheadDFA<wchar_t> *this_local;
  
  __range2._4_4_ = 0;
  this_00 = &(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states;
  pLStack_10 = this;
  __end0 = std::
           vector<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>::
           begin(this_00);
  state = (LDFAState<wchar_t> *)
          std::
          vector<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>::
          end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_Centaurus::LDFAState<wchar_t>_*,_std::vector<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>_>
                                *)&state);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_Centaurus::LDFAState<wchar_t>_*,_std::vector<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>_>
              ::operator*(&__end0);
    this_02 = LDFAState<wchar_t>::get_transitions(this_01);
    __end0_1 = std::
               vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
               ::begin(this_02);
    tr = (NFATransition<wchar_t> *)
         std::
         vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
         ::end(this_02);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end0_1,
                         (__normal_iterator<const_Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
                          *)&tr);
      if (!bVar1) break;
      local_58 = __gnu_cxx::
                 __normal_iterator<const_Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
                 ::operator*(&__end0_1);
      iVar2 = NFATransition<wchar_t>::dest(local_58);
      if (iVar2 < 0) {
        local_5c = NFATransition<wchar_t>::dest(local_58);
        local_5c = -local_5c;
        piVar3 = std::max<int>((int *)((long)&__range2 + 4),&local_5c);
        __range2._4_4_ = *piVar3;
      }
      __gnu_cxx::
      __normal_iterator<const_Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
      ::operator++(&__end0_1);
    }
    __gnu_cxx::
    __normal_iterator<const_Centaurus::LDFAState<wchar_t>_*,_std::vector<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>_>
    ::operator++(&__end0);
  }
  return __range2._4_4_;
}

Assistant:

int get_color_num() const
	{
		int max_color_index = 0;

		for (const auto& state : m_states)
		{
			for (const auto& tr : state.get_transitions())
			{
				if (tr.dest() < 0)
				{
					max_color_index = std::max(max_color_index, -tr.dest());
				}
			}
		}
		return max_color_index;
	}